

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
MemoryFile_ReadFileWithInitialContents_Test::TestBody
          (MemoryFile_ReadFileWithInitialContents_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_d0;
  buffer out;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  size_t elements;
  AssertHelper local_80;
  char source_string [12];
  size_t actual_read;
  in_memory mf;
  not_null<void_*> local_28;
  
  elements = 0xb;
  builtin_strncpy(source_string,"Hello World",0xc);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&mf,"elements","std::strlen (source_string)",&elements,
             (unsigned_long *)&gtest_ar_1);
  if ((char)mf.super_file_base._vptr_file_base == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    std::operator<<((ostream *)(gtest_ar_1._0_8_ + 0x10),"Expected buffer length to be ");
    std::ostream::_M_insert<unsigned_long>(gtest_ar_1._0_8_ + 0x10);
    if (mf.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)mf.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&out,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1ba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&out,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&out);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf.buffer_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf.buffer_);
    std::__cxx11::string::string((string *)&gtest_ar_1,source_string,(allocator *)&actual_read);
    anon_unknown.dwarf_146a0::MemoryFile::make_buffer
              ((MemoryFile *)&gtest_ar_,(string *)&gtest_ar_1);
    out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)gtest_ar_._0_8_;
    out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pstore::file::in_memory::in_memory(&mf,(shared_ptr<void> *)&out,0xb,0xb,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)mf.pos_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar_1,"0U","mf.tell ()",(uint *)&gtest_ar_,(unsigned_long *)&out);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&out);
      std::operator<<((ostream *)
                      (out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x10),"Expected the initial file offset to be 0");
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1be,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&out);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (**(code **)(*(long *)out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)mf.eof_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_1,"elements","mf.size ()",&elements,(unsigned_long *)&out);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&out);
      std::operator<<((ostream *)
                      (out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x10),"Expected the file to be the same size as the string");
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1bf,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&out);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (**(code **)(*(long *)out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    anon_unknown.dwarf_146a0::MemoryFile::make_buffer((MemoryFile *)&out,0xb);
    local_28.ptr_ = out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pstore::gsl::not_null<void_*>::ensure_invariant(&local_28);
    actual_read = pstore::file::in_memory::read_buffer(&mf,local_28,0xb);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_1,"elements","actual_read",&elements,&actual_read);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1c3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      bVar1 = std::__equal<false>::equal<unsigned_char*,char_const*>
                        (out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         0xb,source_string);
      gtest_ar_.success_ = bVar1;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "std::equal (out.get (), out.get () + elements, source_string)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                   ,0x1c4,(char *)gtest_ar_1._0_8_);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        std::__cxx11::string::~string((string *)&gtest_ar_1);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_._0_8_ = mf.pos_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_1,"elements","mf.tell ()",&elements,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                   ,0x1c5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pstore::file::in_memory::~in_memory(&mf);
  }
  return;
}

Assistant:

TEST_F (MemoryFile, ReadFileWithInitialContents) {
    constexpr std::size_t elements = 11;
    char const source_string[elements + 1]{"Hello World"};
    ASSERT_EQ (elements, std::strlen (source_string))
        << "Expected buffer length to be " << elements;
    pstore::file::in_memory mf (MemoryFile::make_buffer (source_string), elements, elements);

    EXPECT_EQ (0U, mf.tell ()) << "Expected the initial file offset to be 0";
    EXPECT_EQ (elements, mf.size ()) << "Expected the file to be the same size as the string";

    auto out = MemoryFile::make_buffer (elements);
    std::size_t const actual_read = mf.read_buffer (out.get (), elements);
    ASSERT_EQ (elements, actual_read);
    EXPECT_TRUE (std::equal (out.get (), out.get () + elements, source_string));
    EXPECT_EQ (elements, mf.tell ());
}